

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitems.h
# Opt level: O0

NormalBumpEvalContext * __thiscall
pbrt::MaterialEvalWorkItem<pbrt::SubsurfaceMaterial>::GetNormalBumpEvalContext
          (MaterialEvalWorkItem<pbrt::SubsurfaceMaterial> *this,Float dudx,Float dudy,Float dvdx,
          Float dvdy)

{
  undefined8 uVar1;
  Point3<pbrt::Interval> p;
  long in_RSI;
  NormalBumpEvalContext *in_RDI;
  Float in_XMM0_Da;
  Float in_XMM1_Da;
  Float in_XMM2_Da;
  Float in_XMM3_Da;
  NormalBumpEvalContext *ctx;
  NormalBumpEvalContext *in_stack_ffffffffffffff90;
  Point3<float> *in_stack_ffffffffffffffa0;
  NormalBumpEvalContext *pNVar2;
  undefined8 local_24;
  float local_1c;
  
  pNVar2 = in_RDI;
  NormalBumpEvalContext::NormalBumpEvalContext(in_stack_ffffffffffffff90);
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y = (Interval)pNVar2;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)in_RDI;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = *(Interval *)(in_RSI + 8);
  Point3<float>::Point3<pbrt::Interval>(in_stack_ffffffffffffffa0,p);
  (in_RDI->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_24;
  (in_RDI->p).super_Tuple3<pbrt::Point3,_float>.y = (float)local_24._4_4_;
  (in_RDI->p).super_Tuple3<pbrt::Point3,_float>.z = local_1c;
  (in_RDI->uv).super_Tuple2<pbrt::Point2,_float> = *(Tuple2<pbrt::Point2,_float> *)(in_RSI + 0x88);
  in_RDI->dudx = in_XMM0_Da;
  in_RDI->dudy = in_XMM1_Da;
  in_RDI->dvdx = in_XMM2_Da;
  in_RDI->dvdy = in_XMM3_Da;
  uVar1 = *(undefined8 *)(in_RSI + 0x4c);
  (in_RDI->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = *(float *)(in_RSI + 0x54);
  uVar1 = *(undefined8 *)(in_RSI + 0x58);
  (in_RDI->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = *(float *)(in_RSI + 0x60);
  uVar1 = *(undefined8 *)(in_RSI + 100);
  (in_RDI->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = *(float *)(in_RSI + 0x6c);
  uVar1 = *(undefined8 *)(in_RSI + 0x70);
  (in_RDI->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z = *(float *)(in_RSI + 0x78);
  uVar1 = *(undefined8 *)(in_RSI + 0x7c);
  (in_RDI->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z = *(float *)(in_RSI + 0x84);
  in_RDI->faceIndex = *(int *)(in_RSI + 0x90);
  return pNVar2;
}

Assistant:

GetNormalBumpEvalContext(Float dudx, Float dudy, Float dvdx,
                                                   Float dvdy) const {
        NormalBumpEvalContext ctx;
        ctx.p = Point3f(pi);
        ctx.uv = uv;
        ctx.dudx = dudx;
        ctx.dudy = dudy;
        ctx.dvdx = dvdx;
        ctx.dvdy = dvdy;
        ctx.shading.n = ns;
        ctx.shading.dpdu = dpdus;
        ctx.shading.dpdv = dpdvs;
        ctx.shading.dndu = dndus;
        ctx.shading.dndv = dndvs;
        ctx.faceIndex = faceIndex;
        return ctx;
    }